

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QUrl>::moveAppend(QGenericArrayOps<QUrl> *this,QUrl *b,QUrl *e)

{
  QUrl *pQVar1;
  long lVar2;
  
  if (b != e) {
    pQVar1 = (this->super_QArrayDataPointer<QUrl>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QUrl>).size;
    for (; b < e; b = b + 1) {
      pQVar1[lVar2].d = b->d;
      b->d = (QUrlPrivate *)0x0;
      (this->super_QArrayDataPointer<QUrl>).size = lVar2 + 1;
      lVar2 = lVar2 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }